

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O2

unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> __thiscall
CS248::GLResourceManager::bindProgram(GLResourceManager *this,ProgramId pid)

{
  undefined8 *puVar1;
  GLuint in_EDX;
  
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = &PTR__ProgramCleanup_002481e0;
  (*__glewUseProgram)(in_EDX);
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<CS248::Cleanup,_std::default_delete<CS248::Cleanup>,_true,_true>)
         (__uniq_ptr_data<CS248::Cleanup,_std::default_delete<CS248::Cleanup>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Cleanup> GLResourceManager::bindProgram(ProgramId pid) {
  return std::unique_ptr<Cleanup>{ new ProgramCleanup(pid) };
}